

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * catmatches(matches *a,matches *b)

{
  int iVar1;
  match *pmVar2;
  long *in_RSI;
  matches *in_RDI;
  int i;
  int local_14;
  
  for (local_14 = 0; local_14 < (int)in_RSI[1]; local_14 = local_14 + 1) {
    if (in_RDI->mmax <= in_RDI->mnum) {
      if (in_RDI->mmax == 0) {
        in_RDI->mmax = 0x10;
      }
      else {
        in_RDI->mmax = in_RDI->mmax << 1;
      }
      pmVar2 = (match *)realloc(in_RDI->m,(long)in_RDI->mmax * 0xb8);
      in_RDI->m = pmVar2;
    }
    iVar1 = in_RDI->mnum;
    in_RDI->mnum = iVar1 + 1;
    memcpy(in_RDI->m + iVar1,(void *)(*in_RSI + (long)local_14 * 0xb8),0xb8);
  }
  free((void *)*in_RSI);
  free(in_RSI);
  return in_RDI;
}

Assistant:

struct matches *catmatches(struct matches *a, struct matches *b) {
	int i;
	for (i = 0; i < b->mnum; i++)
		ADDARRAY(a->m, b->m[i]);
	free(b->m);
	free(b);
	return a;
}